

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_lore_name(parser *p)

{
  wchar_t wVar1;
  monster_lore *pmVar2;
  char *name;
  monster_race *pmVar3;
  monster_lore *v;
  
  name = parser_getstr(p,"name");
  pmVar3 = lookup_monster(name);
  pmVar2 = l_list;
  if (pmVar3 == (monster_race *)0x0) {
    v = (monster_lore *)0x0;
  }
  else {
    wVar1 = pmVar3->ridx;
    v = l_list + (uint)wVar1;
    l_list[(uint)wVar1].ridx = wVar1;
    pmVar2[(uint)wVar1].friends = (monster_friends *)0x0;
    (&pmVar2[(uint)wVar1].friends)[1] = (monster_friends *)0x0;
  }
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_lore_name(struct parser *p) {
	struct monster_race *race = lookup_monster(parser_getstr(p, "name"));
	struct monster_lore *l = NULL;

	/* Only set lore if we have a race, to allow for non-existent monsters */
	if (race) {
		l = &l_list[race->ridx];
		l->ridx = race->ridx;
		l->friends = NULL;
		l->friends_base = NULL;
	}
	parser_setpriv(p, l);
	return PARSE_ERROR_NONE;
}